

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

bool __thiscall TripleBuffer<stStateCore>::changed(TripleBuffer<stStateCore> *this)

{
  byte bVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = *(byte *)&in_RDI[0x32]._M_device;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1aa8bd);
  return (bool)(bVar1 & 1);
}

Assistant:

bool changed() {
        std::lock_guard<std::mutex> lock(mutex);
        return hasChanged;
    }